

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim.c
# Opt level: O0

double SSIMGet_C(uint8_t *src1,int stride1,uint8_t *src2,int stride2)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  double dVar4;
  uint32_t s2;
  uint32_t s1;
  uint32_t w;
  int y;
  int x;
  VP8DistoStats stats;
  int local_3c;
  int local_38;
  undefined1 local_34 [4];
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  int local_c;
  long local_8;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_34,0,0x18);
  for (local_3c = 0; local_3c < 7; local_3c = local_3c + 1) {
    for (local_38 = 0; local_38 < 7; local_38 = local_38 + 1) {
      iVar1 = kWeight[local_38] * kWeight[local_3c];
      uVar2 = (uint)*(byte *)(local_8 + local_38);
      uVar3 = (uint)*(byte *)(local_18 + local_38);
      local_30 = iVar1 * uVar2 + local_30;
      local_2c = iVar1 * uVar3 + local_2c;
      local_28 = iVar1 * uVar2 * uVar2 + local_28;
      local_24 = iVar1 * uVar2 * uVar3 + local_24;
      local_20 = iVar1 * uVar3 * uVar3 + local_20;
    }
    local_8 = local_8 + local_c;
    local_18 = local_18 + local_1c;
  }
  dVar4 = VP8SSIMFromStats((VP8DistoStats *)0x1cdfd7);
  return dVar4;
}

Assistant:

static double SSIMGet_C(const uint8_t* src1, int stride1,
                        const uint8_t* src2, int stride2) {
  VP8DistoStats stats = { 0, 0, 0, 0, 0, 0 };
  int x, y;
  for (y = 0; y <= 2 * VP8_SSIM_KERNEL; ++y, src1 += stride1, src2 += stride2) {
    for (x = 0; x <= 2 * VP8_SSIM_KERNEL; ++x) {
      const uint32_t w = kWeight[x] * kWeight[y];
      const uint32_t s1 = src1[x];
      const uint32_t s2 = src2[x];
      stats.xm  += w * s1;
      stats.ym  += w * s2;
      stats.xxm += w * s1 * s1;
      stats.xym += w * s1 * s2;
      stats.yym += w * s2 * s2;
    }
  }
  return VP8SSIMFromStats(&stats);
}